

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myentity.cpp
# Opt level: O2

void __thiscall MyEntity::MyEntity(MyEntity *this,string *n)

{
  MetaSim::Entity::Entity(&this->super_Entity,n);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR__MyEntity_0017c840;
  this->afirst = false;
  this->bfirst = false;
  this->count = 0;
  MetaSim::GEvent<MyEntity>::GEvent(&this->eventA,this,0x13eece,0);
  MetaSim::GEvent<MyEntity>::GEvent(&this->eventB,this,0x13eefc,0);
  MetaSim::GEvent<MyEntity>::GEvent(&this->eventC,this,0x13ef2e,0);
  return;
}

Assistant:

MyEntity::MyEntity(const std::string &n) : Entity(n),
					   afirst(false),
					   bfirst(false),
					   count(0),
					   eventA(this, &MyEntity::onEventA),
					   eventB(this, &MyEntity::onEventB),
					   eventC(this, &MyEntity::onEventC)
{
}